

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O3

int run_test_tcp_open_twice(void)

{
  uv_stream_t *puVar1;
  uv_os_sock_t uVar2;
  uint uVar3;
  int iVar4;
  int extraout_EAX;
  undefined8 uVar5;
  ulong uVar6;
  void *pvVar7;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  int iVar8;
  long *plVar9;
  uv_connect_cb p_Var10;
  code *pcVar11;
  long *plVar12;
  uv_shutdown_t *puVar13;
  undefined1 *puVar14;
  uv_connect_t *puVar15;
  int64_t eval_b;
  int64_t eval_a;
  uv_tcp_t client;
  long alStack_3b8 [2];
  undefined1 auStack_3a8 [16];
  code *pcStack_398;
  void *pvStack_390;
  undefined1 auStack_388 [64];
  void *pvStack_348;
  uv_connect_cb ap_Stack_340 [2];
  uv__queue *puStack_330;
  uv__queue *puStack_328;
  code *pcStack_320;
  long lStack_310;
  long lStack_308;
  undefined1 auStack_300 [16];
  sockaddr sStack_2f0;
  long alStack_2e0 [27];
  code *pcStack_208;
  long lStack_1f8;
  long lStack_1f0;
  sockaddr sStack_1e8;
  long alStack_1d8 [27];
  code *pcStack_100;
  long local_f8;
  long local_f0;
  undefined1 local_e8 [216];
  
  pcStack_100 = (code *)0x1cd2b5;
  uVar2 = create_tcp_socket();
  pcStack_100 = (code *)0x1cd2bc;
  uVar3 = create_tcp_socket();
  uVar6 = (ulong)uVar3;
  pcStack_100 = (code *)0x1cd2c3;
  uVar5 = uv_default_loop();
  pcStack_100 = (code *)0x1cd2d0;
  iVar4 = uv_tcp_init(uVar5,local_e8);
  local_f0 = (long)iVar4;
  local_f8 = 0;
  if (local_f0 == 0) {
    pcStack_100 = (code *)0x1cd2fa;
    iVar4 = uv_tcp_open(local_e8,uVar2);
    local_f0 = (long)iVar4;
    local_f8 = 0;
    if (local_f0 != 0) goto LAB_001cd3ea;
    pcStack_100 = (code *)0x1cd324;
    iVar4 = uv_tcp_open(local_e8,uVar3);
    local_f0 = (long)iVar4;
    local_f8 = -0x10;
    if (local_f0 != -0x10) goto LAB_001cd3f7;
    pcStack_100 = (code *)0x1cd349;
    iVar4 = close(uVar3);
    local_f0 = (long)iVar4;
    local_f8 = 0;
    if (local_f0 != 0) goto LAB_001cd404;
    pcStack_100 = (code *)0x1cd373;
    uv_close(local_e8,0);
    pcStack_100 = (code *)0x1cd378;
    uVar5 = uv_default_loop();
    pcStack_100 = (code *)0x1cd382;
    uv_run(uVar5,0);
    pcStack_100 = (code *)0x1cd387;
    uVar6 = uv_default_loop();
    pcStack_100 = (code *)0x1cd39b;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_100 = (code *)0x1cd3a5;
    uv_run(uVar6,0);
    local_f0 = 0;
    pcStack_100 = (code *)0x1cd3b3;
    uVar5 = uv_default_loop();
    pcStack_100 = (code *)0x1cd3bb;
    iVar4 = uv_loop_close(uVar5);
    local_f8 = (long)iVar4;
    if (local_f0 == local_f8) {
      pcStack_100 = (code *)0x1cd3d1;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_100 = (code *)0x1cd3ea;
    run_test_tcp_open_twice_cold_1();
LAB_001cd3ea:
    pcStack_100 = (code *)0x1cd3f7;
    run_test_tcp_open_twice_cold_2();
LAB_001cd3f7:
    pcStack_100 = (code *)0x1cd404;
    run_test_tcp_open_twice_cold_3();
LAB_001cd404:
    pcStack_100 = (code *)0x1cd411;
    run_test_tcp_open_twice_cold_4();
  }
  pcStack_100 = run_test_tcp_open_bound;
  run_test_tcp_open_twice_cold_5();
  pcStack_208 = (code *)0x1cd42b;
  pcStack_100 = (code *)uVar6;
  uVar3 = create_tcp_socket();
  pvVar7 = (void *)(ulong)uVar3;
  pcStack_208 = (code *)0x1cd443;
  iVar4 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_1e8);
  alStack_1d8[0] = (long)iVar4;
  lStack_1f8 = 0;
  if (alStack_1d8[0] == 0) {
    pcStack_208 = (code *)0x1cd468;
    uVar5 = uv_default_loop();
    pcStack_208 = (code *)0x1cd475;
    iVar4 = uv_tcp_init(uVar5,alStack_1d8);
    lStack_1f8 = (long)iVar4;
    lStack_1f0 = 0;
    if (lStack_1f8 != 0) goto LAB_001cd58e;
    pcStack_208 = (code *)0x1cd4a6;
    iVar4 = bind(uVar3,&sStack_1e8,0x10);
    lStack_1f8 = (long)iVar4;
    lStack_1f0 = 0;
    if (lStack_1f8 != 0) goto LAB_001cd59d;
    pcStack_208 = (code *)0x1cd4d2;
    iVar4 = uv_tcp_open(alStack_1d8,uVar3);
    lStack_1f8 = (long)iVar4;
    lStack_1f0 = 0;
    if (lStack_1f8 != 0) goto LAB_001cd5ac;
    pcStack_208 = (code *)0x1cd503;
    iVar4 = uv_listen(alStack_1d8,0x80,0);
    lStack_1f8 = (long)iVar4;
    lStack_1f0 = 0;
    if (lStack_1f8 != 0) goto LAB_001cd5bb;
    pcStack_208 = (code *)0x1cd528;
    pvVar7 = (void *)uv_default_loop();
    pcStack_208 = (code *)0x1cd53c;
    uv_walk(pvVar7,close_walk_cb,0);
    pcStack_208 = (code *)0x1cd546;
    uv_run(pvVar7,0);
    lStack_1f8 = 0;
    pcStack_208 = (code *)0x1cd554;
    uVar5 = uv_default_loop();
    pcStack_208 = (code *)0x1cd55c;
    iVar4 = uv_loop_close(uVar5);
    lStack_1f0 = (long)iVar4;
    if (lStack_1f8 == lStack_1f0) {
      pcStack_208 = (code *)0x1cd574;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_208 = (code *)0x1cd58e;
    run_test_tcp_open_bound_cold_1();
LAB_001cd58e:
    pcStack_208 = (code *)0x1cd59d;
    run_test_tcp_open_bound_cold_2();
LAB_001cd59d:
    pcStack_208 = (code *)0x1cd5ac;
    run_test_tcp_open_bound_cold_3();
LAB_001cd5ac:
    pcStack_208 = (code *)0x1cd5bb;
    run_test_tcp_open_bound_cold_4();
LAB_001cd5bb:
    pcStack_208 = (code *)0x1cd5ca;
    run_test_tcp_open_bound_cold_5();
  }
  pcStack_208 = run_test_tcp_open_connected;
  run_test_tcp_open_bound_cold_6();
  pcStack_320 = (code *)0x1cd5f2;
  pcStack_208 = (code *)pvVar7;
  auStack_300 = uv_buf_init("PING",4);
  pcStack_320 = (code *)0x1cd612;
  iVar4 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_2f0);
  alStack_2e0[0] = (long)iVar4;
  lStack_310 = 0;
  if (alStack_2e0[0] == 0) {
    pcStack_320 = (code *)0x1cd637;
    uVar3 = create_tcp_socket();
    pvVar7 = (void *)(ulong)uVar3;
    pcStack_320 = (code *)0x1cd64a;
    iVar4 = connect(uVar3,&sStack_2f0,0x10);
    alStack_2e0[0] = (long)iVar4;
    lStack_310 = 0;
    if (alStack_2e0[0] != 0) goto LAB_001cd867;
    pcStack_320 = (code *)0x1cd66f;
    uVar5 = uv_default_loop();
    pcStack_320 = (code *)0x1cd67c;
    iVar4 = uv_tcp_init(uVar5,alStack_2e0);
    lStack_310 = (long)iVar4;
    lStack_308 = 0;
    if (lStack_310 != 0) goto LAB_001cd876;
    pcStack_320 = (code *)0x1cd6a8;
    iVar4 = uv_tcp_open(alStack_2e0,uVar3);
    lStack_310 = (long)iVar4;
    lStack_308 = 0;
    if (lStack_310 != 0) goto LAB_001cd885;
    pcStack_320 = (code *)0x1cd6ea;
    iVar4 = uv_write(&write_req,alStack_2e0,auStack_300,1,write_cb);
    lStack_310 = (long)iVar4;
    lStack_308 = 0;
    if (lStack_310 != 0) goto LAB_001cd894;
    pcStack_320 = (code *)0x1cd722;
    iVar4 = uv_shutdown(&shutdown_req,alStack_2e0,shutdown_cb);
    lStack_310 = (long)iVar4;
    lStack_308 = 0;
    if (lStack_310 != 0) goto LAB_001cd8a3;
    pcStack_320 = (code *)0x1cd75a;
    iVar4 = uv_read_start(alStack_2e0,alloc_cb,read_cb);
    lStack_310 = (long)iVar4;
    lStack_308 = 0;
    if (lStack_310 != 0) goto LAB_001cd8b2;
    pcStack_320 = (code *)0x1cd77f;
    uVar5 = uv_default_loop();
    pcStack_320 = (code *)0x1cd789;
    uv_run(uVar5,0);
    lStack_310 = 1;
    lStack_308 = (long)shutdown_cb_called;
    if (lStack_308 != 1) goto LAB_001cd8c1;
    lStack_310 = 1;
    lStack_308 = (long)write_cb_called;
    if (lStack_308 != 1) goto LAB_001cd8d0;
    lStack_310 = 1;
    lStack_308 = (long)close_cb_called;
    if (lStack_308 != 1) goto LAB_001cd8df;
    pcStack_320 = (code *)0x1cd7fd;
    pvVar7 = (void *)uv_default_loop();
    pcStack_320 = (code *)0x1cd811;
    uv_walk(pvVar7,close_walk_cb,0);
    pcStack_320 = (code *)0x1cd81b;
    uv_run(pvVar7,0);
    lStack_310 = 0;
    pcStack_320 = (code *)0x1cd829;
    uVar5 = uv_default_loop();
    pcStack_320 = (code *)0x1cd831;
    iVar4 = uv_loop_close(uVar5);
    lStack_308 = (long)iVar4;
    if (lStack_310 == lStack_308) {
      pcStack_320 = (code *)0x1cd84d;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_320 = (code *)0x1cd867;
    run_test_tcp_open_connected_cold_1();
LAB_001cd867:
    pcStack_320 = (code *)0x1cd876;
    run_test_tcp_open_connected_cold_2();
LAB_001cd876:
    pcStack_320 = (code *)0x1cd885;
    run_test_tcp_open_connected_cold_3();
LAB_001cd885:
    pcStack_320 = (code *)0x1cd894;
    run_test_tcp_open_connected_cold_4();
LAB_001cd894:
    pcStack_320 = (code *)0x1cd8a3;
    run_test_tcp_open_connected_cold_5();
LAB_001cd8a3:
    pcStack_320 = (code *)0x1cd8b2;
    run_test_tcp_open_connected_cold_6();
LAB_001cd8b2:
    pcStack_320 = (code *)0x1cd8c1;
    run_test_tcp_open_connected_cold_7();
LAB_001cd8c1:
    pcStack_320 = (code *)0x1cd8d0;
    run_test_tcp_open_connected_cold_8();
LAB_001cd8d0:
    pcStack_320 = (code *)0x1cd8df;
    run_test_tcp_open_connected_cold_9();
LAB_001cd8df:
    pcStack_320 = (code *)0x1cd8ee;
    run_test_tcp_open_connected_cold_10();
  }
  plVar12 = &lStack_310;
  plVar9 = &lStack_308;
  pcStack_320 = write_cb;
  run_test_tcp_open_connected_cold_11();
  if (plVar12 == (long *)0x0) {
    puStack_328 = (uv__queue *)0x1cd914;
    write_cb_cold_2();
  }
  else if ((int)plVar9 == 0) {
    write_cb_called = write_cb_called + 1;
    return extraout_EAX;
  }
  iVar4 = (int)plVar9;
  puVar13 = (uv_shutdown_t *)((ulong)plVar9 & 0xffffffff);
  puStack_328 = (uv__queue *)shutdown_cb;
  write_cb_cold_1();
  if (puVar13 == &shutdown_req) {
    puStack_328 = (uv__queue *)(long)iVar4;
    puStack_330 = (uv__queue *)0x0;
    if (puStack_328 == (uv__queue *)0x0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return iVar4;
    }
  }
  else {
    ap_Stack_340[0] = (uv_connect_cb)0x1cd958;
    shutdown_cb_cold_1();
  }
  p_Var10 = (uv_connect_cb)(auStack_388 + 0x58);
  ap_Stack_340[0] = alloc_cb;
  shutdown_cb_cold_2();
  pvStack_348 = (void *)0x10000;
  if ((long)p_Var10 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x37fb20;
  }
  puVar14 = auStack_388 + 0x48;
  pcVar11 = (code *)(auStack_388 + 0x40);
  auStack_388._48_8_ = read_cb;
  ap_Stack_340[0] = p_Var10;
  alloc_cb_cold_1();
  if (puVar14 == (undefined1 *)0x0) {
    auStack_388._24_8_ = (void *)0x1cda38;
    read_cb_cold_4();
LAB_001cda38:
    auStack_388._24_8_ = (void *)0x1cda47;
    read_cb_cold_2();
LAB_001cda47:
    auStack_388._24_8_ = (void *)0x1cda56;
    read_cb_cold_3();
  }
  else {
    if (-1 < (long)pcVar11) {
      auStack_388._48_8_ = (code *)0x4;
      auStack_388._40_8_ = pcVar11;
      if (pcVar11 != (code *)0x4) goto LAB_001cda38;
      auStack_388._24_8_ = (void *)0x1cd9e8;
      iVar4 = memcmp("PING",(void *)*extraout_RDX_00,4);
      auStack_388._48_8_ = SEXT48(iVar4);
      auStack_388._40_8_ = (code *)0x0;
      if ((code *)auStack_388._48_8_ == (code *)0x0) {
        return iVar4;
      }
      goto LAB_001cda47;
    }
    auStack_388._40_8_ = (code *)0xfffffffffffff001;
    auStack_388._48_8_ = pcVar11;
    if (pcVar11 == (code *)0xfffffffffffff001) {
      iVar4 = uv_close();
      return iVar4;
    }
  }
  auStack_388._24_8_ = run_test_tcp_write_ready;
  read_cb_cold_1();
  iVar8 = (int)&pvStack_390;
  pcStack_398 = (code *)0x1cda80;
  auStack_388._24_8_ = pvVar7;
  iVar4 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_388 + 8);
  auStack_388._0_8_ = SEXT48(iVar4);
  pvStack_390 = (void *)0x0;
  if ((void *)auStack_388._0_8_ == (void *)0x0) {
    pcStack_398 = (code *)0x1cdaa3;
    uVar3 = create_tcp_socket();
    pvVar7 = (void *)(ulong)uVar3;
    pcStack_398 = (code *)0x1cdaaa;
    uVar5 = uv_default_loop();
    pcStack_398 = (code *)0x1cdab9;
    iVar4 = uv_tcp_init(uVar5,&::client);
    auStack_388._0_8_ = SEXT48(iVar4);
    pvStack_390 = (void *)0x0;
    if ((void *)auStack_388._0_8_ != (void *)0x0) goto LAB_001cdc66;
    pcStack_398 = (code *)0x1cdae5;
    iVar4 = uv_tcp_open(&::client,uVar3);
    auStack_388._0_8_ = SEXT48(iVar4);
    pvStack_390 = (void *)0x0;
    if ((void *)auStack_388._0_8_ != (void *)0x0) goto LAB_001cdc73;
    pcStack_398 = (code *)0x1cdb22;
    iVar4 = uv_tcp_connect(&connect_req,&::client,auStack_388 + 8,connect1_cb);
    auStack_388._0_8_ = SEXT48(iVar4);
    pvStack_390 = (void *)0x0;
    if ((void *)auStack_388._0_8_ != (void *)0x0) goto LAB_001cdc80;
    pcStack_398 = (code *)0x1cdb45;
    uVar5 = uv_default_loop();
    pcStack_398 = (code *)0x1cdb4f;
    uv_run(uVar5,0);
    auStack_388._0_8_ = (void *)0x1;
    pvStack_390 = (void *)(long)shutdown_cb_called;
    if (pvStack_390 != (void *)0x1) goto LAB_001cdc8d;
    auStack_388._0_8_ = (void *)0x1;
    pvStack_390 = (void *)(long)shutdown_requested;
    if (pvStack_390 != (void *)0x1) goto LAB_001cdc9a;
    auStack_388._0_8_ = (void *)0x1;
    pvStack_390 = (void *)(long)connect_cb_called;
    if (pvStack_390 != (void *)0x1) goto LAB_001cdca7;
    auStack_388._0_8_ = SEXT48(write_cb_called);
    pvStack_390 = (void *)0x0;
    if ((long)auStack_388._0_8_ < 1) goto LAB_001cdcb4;
    auStack_388._0_8_ = (void *)0x1;
    pvStack_390 = (void *)(long)close_cb_called;
    if (pvStack_390 != (void *)0x1) goto LAB_001cdcc1;
    pcStack_398 = (code *)0x1cdc03;
    pvVar7 = (void *)uv_default_loop();
    pcStack_398 = (code *)0x1cdc17;
    uv_walk(pvVar7,close_walk_cb,0);
    pcStack_398 = (code *)0x1cdc21;
    uv_run(pvVar7,0);
    auStack_388._0_8_ = (void *)0x0;
    pcStack_398 = (code *)0x1cdc2f;
    uVar5 = uv_default_loop();
    pcStack_398 = (code *)0x1cdc37;
    iVar4 = uv_loop_close(uVar5);
    pvStack_390 = (void *)(long)iVar4;
    if ((void *)auStack_388._0_8_ == pvStack_390) {
      pcStack_398 = (code *)0x1cdc51;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_398 = (code *)0x1cdc66;
    run_test_tcp_write_ready_cold_1();
LAB_001cdc66:
    pcStack_398 = (code *)0x1cdc73;
    run_test_tcp_write_ready_cold_2();
LAB_001cdc73:
    pcStack_398 = (code *)0x1cdc80;
    run_test_tcp_write_ready_cold_3();
LAB_001cdc80:
    pcStack_398 = (code *)0x1cdc8d;
    run_test_tcp_write_ready_cold_4();
LAB_001cdc8d:
    pcStack_398 = (code *)0x1cdc9a;
    run_test_tcp_write_ready_cold_5();
LAB_001cdc9a:
    pcStack_398 = (code *)0x1cdca7;
    run_test_tcp_write_ready_cold_6();
LAB_001cdca7:
    pcStack_398 = (code *)0x1cdcb4;
    run_test_tcp_write_ready_cold_7();
LAB_001cdcb4:
    pcStack_398 = (code *)0x1cdcc1;
    run_test_tcp_write_ready_cold_8();
LAB_001cdcc1:
    pcStack_398 = (code *)0x1cdcce;
    run_test_tcp_write_ready_cold_9();
  }
  puVar15 = (uv_connect_t *)auStack_388;
  pcStack_398 = connect1_cb;
  run_test_tcp_write_ready_cold_10();
  puVar1 = connect_req.handle;
  plVar12 = alStack_3b8;
  pcStack_398 = (code *)pvVar7;
  if (puVar15 == &connect_req) {
    auStack_3a8._0_8_ = SEXT48(iVar8);
    alStack_3b8[0] = 0;
    if (auStack_3a8._0_8_ != 0) goto LAB_001cde16;
    connect_cb_called = connect_cb_called + 1;
    uVar5 = uv_default_loop();
    iVar4 = uv_timer_init(uVar5,&tm);
    auStack_3a8._0_8_ = SEXT48(iVar4);
    alStack_3b8[0] = 0;
    if (auStack_3a8._0_8_ != 0) goto LAB_001cde23;
    iVar4 = uv_timer_start(&tm,timer_cb,2000,0);
    auStack_3a8._0_8_ = SEXT48(iVar4);
    alStack_3b8[0] = 0;
    if (auStack_3a8._0_8_ != 0) goto LAB_001cde30;
    auStack_3a8 = uv_buf_init("P",1);
    iVar4 = uv_write(&write_req,puVar1,auStack_3a8,1,write1_cb);
    alStack_3b8[0] = (long)iVar4;
    alStack_3b8[1] = 0;
    if (alStack_3b8[0] == 0) {
      iVar4 = uv_read_start(puVar1,alloc_cb,read1_cb);
      alStack_3b8[0] = (long)iVar4;
      alStack_3b8[1] = 0;
      if (alStack_3b8[0] == 0) {
        return iVar4;
      }
      goto LAB_001cde4a;
    }
  }
  else {
    connect1_cb_cold_1();
LAB_001cde16:
    connect1_cb_cold_2();
LAB_001cde23:
    connect1_cb_cold_3();
LAB_001cde30:
    connect1_cb_cold_4();
  }
  connect1_cb_cold_5();
LAB_001cde4a:
  connect1_cb_cold_6();
  iVar4 = uv_is_closing();
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = uv_close(plVar12,0);
  return iVar4;
}

Assistant:

TEST_IMPL(tcp_open_twice) {
  uv_tcp_t client;
  uv_os_sock_t sock1, sock2;
  int r;

  startup();
  sock1 = create_tcp_socket();
  sock2 = create_tcp_socket();

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  r = uv_tcp_open(&client, sock1);
  ASSERT_OK(r);

  r = uv_tcp_open(&client, sock2);
  ASSERT_EQ(r, UV_EBUSY);
  close_socket(sock2);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}